

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_queue.cpp
# Opt level: O3

void mpmc_basics<int,4ul>(void)

{
  code *pcVar1;
  double dVar2;
  char extraout_AL;
  bool bVar3;
  char extraout_AL_00;
  char extraout_AL_01;
  char extraout_AL_02;
  char extraout_AL_03;
  char extraout_AL_04;
  char extraout_AL_05;
  char extraout_AL_06;
  char extraout_AL_07;
  char extraout_AL_08;
  char extraout_AL_09;
  char extraout_AL_10;
  char extraout_AL_11;
  char extraout_AL_12;
  ulong *puVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Da_01;
  undefined4 extraout_XMM0_Da_02;
  undefined4 extraout_XMM0_Da_03;
  undefined4 extraout_XMM0_Da_04;
  undefined4 extraout_XMM0_Da_05;
  undefined4 extraout_XMM0_Da_06;
  undefined4 extraout_XMM0_Da_07;
  undefined4 extraout_XMM0_Da_08;
  undefined4 extraout_XMM0_Da_09;
  undefined4 extraout_XMM0_Da_10;
  undefined4 extraout_XMM0_Da_11;
  undefined4 extraout_XMM0_Da_12;
  undefined4 extraout_XMM0_Da_13;
  undefined4 extraout_XMM0_Da_14;
  undefined4 extraout_XMM0_Da_15;
  undefined4 extraout_XMM0_Da_16;
  undefined4 extraout_XMM0_Da_17;
  undefined4 extraout_XMM0_Da_18;
  undefined4 extraout_XMM0_Da_19;
  undefined4 extraout_XMM0_Da_20;
  undefined4 extraout_XMM0_Da_21;
  undefined4 extraout_XMM0_Da_22;
  undefined4 uVar10;
  undefined4 extraout_XMM0_Da_23;
  undefined4 extraout_XMM0_Da_24;
  undefined4 extraout_XMM0_Da_25;
  undefined4 extraout_XMM0_Da_26;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  undefined4 extraout_XMM0_Db_03;
  undefined4 extraout_XMM0_Db_04;
  undefined4 extraout_XMM0_Db_05;
  undefined4 extraout_XMM0_Db_06;
  undefined4 extraout_XMM0_Db_07;
  undefined4 extraout_XMM0_Db_08;
  undefined4 extraout_XMM0_Db_09;
  undefined4 extraout_XMM0_Db_10;
  undefined4 extraout_XMM0_Db_11;
  undefined4 extraout_XMM0_Db_12;
  undefined4 extraout_XMM0_Db_13;
  undefined4 extraout_XMM0_Db_14;
  undefined4 extraout_XMM0_Db_15;
  undefined4 extraout_XMM0_Db_16;
  undefined4 extraout_XMM0_Db_17;
  undefined4 extraout_XMM0_Db_18;
  undefined4 extraout_XMM0_Db_19;
  undefined4 extraout_XMM0_Db_20;
  undefined4 extraout_XMM0_Db_21;
  undefined4 extraout_XMM0_Db_22;
  undefined4 uVar11;
  undefined4 extraout_XMM0_Db_23;
  undefined4 extraout_XMM0_Db_24;
  undefined4 extraout_XMM0_Db_25;
  undefined4 extraout_XMM0_Db_26;
  ResultBuilder DOCTEST_RB;
  size_t N;
  MPMC<int,_4UL> mpmc;
  bool local_3c1;
  Result local_3c0;
  ResultBuilder local_3a0;
  Expression_lhs<const_unsigned_long> local_320;
  undefined4 *local_310;
  unsigned_long local_308;
  uint auStack_300 [2];
  ulong local_2f8 [31];
  ulong local_200;
  ulong local_180;
  
  puVar4 = local_2f8;
  uVar6 = 0;
  do {
    *puVar4 = uVar6;
    uVar6 = uVar6 + 1;
    puVar4 = puVar4 + 2;
  } while (uVar6 != 0x10);
  local_200 = 0;
  local_180 = 0;
  local_308 = 0x10;
  local_310 = (undefined4 *)operator_new(0x44);
  *local_310 = 0xffffffff;
  local_310[1] = 0xffffffff;
  local_310[2] = 0xffffffff;
  local_310[3] = 0xffffffff;
  local_310[4] = 0xffffffff;
  local_310[5] = 0xffffffff;
  local_310[6] = 0xffffffff;
  local_310[7] = 0xffffffff;
  local_310[8] = 0xffffffff;
  local_310[9] = 0xffffffff;
  local_310[10] = 0xffffffff;
  local_310[0xb] = 0xffffffff;
  local_310[0xc] = 0xffffffff;
  local_310[0xd] = 0xffffffff;
  local_310[0xe] = 0xffffffff;
  local_310[0xf] = 0xffffffff;
  local_310[0x10] = 0xffffffff;
  local_3a0.super_AssertData.m_exception.field_0.buf[0] = '\0';
  local_3a0.super_AssertData.m_exception.field_0.buf[0x17] = '\x17';
  local_3a0.super_AssertData.m_decomp.field_0.buf[0] = '\0';
  local_3a0.super_AssertData.m_decomp.field_0.buf[0x17] = '\x17';
  local_3a0.super_AssertData.m_test_case = *(TestCaseData **)(doctest::detail::g_cs + 0x20);
  local_3a0.super_AssertData.m_at = DT_REQUIRE;
  local_3a0.super_AssertData.m_file =
       "/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_queue.cpp"
  ;
  local_3a0.super_AssertData.m_line = 0x186;
  local_3a0.super_AssertData.m_expr = "mpmc.capacity() == N";
  local_3a0.super_AssertData.m_failed = true;
  local_3a0.super_AssertData.m_threw = false;
  local_3a0.super_AssertData.m_threw_as = false;
  local_3a0.super_AssertData.m_exception_type = "";
  local_3a0.super_AssertData.m_exception_string = "";
  local_320.lhs = 0x10;
  local_320.m_at = DT_REQUIRE;
  doctest::detail::Expression_lhs<const_unsigned_long>::operator==<unsigned_long,_nullptr>
            (&local_3c0,&local_320,&local_308);
  doctest::String::operator=(&local_3a0.super_AssertData.m_decomp,&local_3c0.m_decomp);
  local_3a0.super_AssertData._40_2_ =
       CONCAT11(local_3a0.super_AssertData.m_threw,local_3c0.m_passed) ^ 1;
  uVar10 = extraout_XMM0_Da;
  uVar11 = extraout_XMM0_Db;
  if ((local_3c0.m_decomp.field_0.buf[0x17] < '\0') &&
     (local_3c0.m_decomp.field_0.data.ptr != (char *)0x0)) {
    operator_delete__(local_3c0.m_decomp.field_0.data.ptr);
    uVar10 = extraout_XMM0_Da_00;
    uVar11 = extraout_XMM0_Db_00;
  }
  dVar2 = doctest::detail::ResultBuilder::log(&local_3a0,(double)CONCAT44(uVar11,uVar10));
  if (extraout_AL != '\0') {
    pcVar1 = (code *)swi(3);
    (*pcVar1)(SUB84(dVar2,0));
    return;
  }
  if ((local_3a0.super_AssertData.m_failed == true) &&
     (bVar3 = doctest::detail::checkIfShouldThrow(local_3a0.super_AssertData.m_at), bVar3)) {
    doctest::detail::throwException();
  }
  if ((local_3a0.super_AssertData.m_decomp.field_0.buf[0x17] < '\0') &&
     ((void *)CONCAT71(local_3a0.super_AssertData.m_decomp.field_0._1_7_,
                       local_3a0.super_AssertData.m_decomp.field_0.buf[0]) != (void *)0x0)) {
    operator_delete__((void *)CONCAT71(local_3a0.super_AssertData.m_decomp.field_0._1_7_,
                                       local_3a0.super_AssertData.m_decomp.field_0.buf[0]));
  }
  if ((local_3a0.super_AssertData.m_exception.field_0.buf[0x17] < '\0') &&
     ((void *)CONCAT71(local_3a0.super_AssertData.m_exception.field_0._1_7_,
                       local_3a0.super_AssertData.m_exception.field_0.buf[0]) != (void *)0x0)) {
    operator_delete__((void *)CONCAT71(local_3a0.super_AssertData.m_exception.field_0._1_7_,
                                       local_3a0.super_AssertData.m_exception.field_0.buf[0]));
  }
  local_3a0.super_AssertData.m_exception.field_0.buf[0] = '\0';
  local_3a0.super_AssertData.m_exception.field_0.buf[0x17] = '\x17';
  local_3a0.super_AssertData.m_decomp.field_0.buf[0] = '\0';
  local_3a0.super_AssertData.m_decomp.field_0.buf[0x17] = '\x17';
  local_3a0.super_AssertData.m_test_case = *(TestCaseData **)(doctest::detail::g_cs + 0x20);
  local_3a0.super_AssertData.m_at = DT_REQUIRE;
  local_3a0.super_AssertData.m_file =
       "/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_queue.cpp"
  ;
  local_3a0.super_AssertData.m_line = 0x188;
  local_3a0.super_AssertData.m_expr = "mpmc.empty() == true";
  local_3a0.super_AssertData.m_failed = true;
  local_3a0.super_AssertData.m_threw = false;
  local_3a0.super_AssertData.m_threw_as = false;
  local_3a0.super_AssertData.m_exception_type = "";
  local_3a0.super_AssertData.m_exception_string = "";
  local_320.lhs = 0xc00000001 - (ulong)(local_180 < local_200);
  local_3c1 = true;
  doctest::detail::Expression_lhs<bool_const>::operator==
            (&local_3c0,(Expression_lhs<bool_const> *)&local_320,&local_3c1);
  doctest::String::operator=(&local_3a0.super_AssertData.m_decomp,&local_3c0.m_decomp);
  local_3a0.super_AssertData._40_2_ =
       CONCAT11(local_3a0.super_AssertData.m_threw,local_3c0.m_passed) ^ 1;
  uVar10 = extraout_XMM0_Da_01;
  uVar11 = extraout_XMM0_Db_01;
  if ((local_3c0.m_decomp.field_0.buf[0x17] < '\0') &&
     (local_3c0.m_decomp.field_0.data.ptr != (char *)0x0)) {
    operator_delete__(local_3c0.m_decomp.field_0.data.ptr);
    uVar10 = extraout_XMM0_Da_02;
    uVar11 = extraout_XMM0_Db_02;
  }
  dVar2 = doctest::detail::ResultBuilder::log(&local_3a0,(double)CONCAT44(uVar11,uVar10));
  if (extraout_AL_00 != '\0') {
    pcVar1 = (code *)swi(3);
    (*pcVar1)(SUB84(dVar2,0));
    return;
  }
  if ((local_3a0.super_AssertData.m_failed == true) &&
     (bVar3 = doctest::detail::checkIfShouldThrow(local_3a0.super_AssertData.m_at), bVar3)) {
    doctest::detail::throwException();
  }
  if ((local_3a0.super_AssertData.m_decomp.field_0.buf[0x17] < '\0') &&
     ((void *)CONCAT71(local_3a0.super_AssertData.m_decomp.field_0._1_7_,
                       local_3a0.super_AssertData.m_decomp.field_0.buf[0]) != (void *)0x0)) {
    operator_delete__((void *)CONCAT71(local_3a0.super_AssertData.m_decomp.field_0._1_7_,
                                       local_3a0.super_AssertData.m_decomp.field_0.buf[0]));
  }
  if ((local_3a0.super_AssertData.m_exception.field_0.buf[0x17] < '\0') &&
     ((void *)CONCAT71(local_3a0.super_AssertData.m_exception.field_0._1_7_,
                       local_3a0.super_AssertData.m_exception.field_0.buf[0]) != (void *)0x0)) {
    operator_delete__((void *)CONCAT71(local_3a0.super_AssertData.m_exception.field_0._1_7_,
                                       local_3a0.super_AssertData.m_exception.field_0.buf[0]));
  }
  local_320.lhs = 0;
  local_3a0.super_AssertData.m_exception.field_0.buf[0] = '\0';
  local_3a0.super_AssertData.m_exception.field_0.buf[0x17] = '\x17';
  local_3a0.super_AssertData.m_decomp.field_0.buf[0] = '\0';
  local_3a0.super_AssertData.m_decomp.field_0.buf[0x17] = '\x17';
  local_3a0.super_AssertData.m_test_case = *(TestCaseData **)(doctest::detail::g_cs + 0x20);
  local_3a0.super_AssertData.m_at = DT_REQUIRE;
  local_3a0.super_AssertData.m_file =
       "/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_queue.cpp"
  ;
  local_3a0.super_AssertData.m_line = 0x189;
  local_3a0.super_AssertData.m_expr = "mpmc.try_dequeue() == std::nullopt";
  local_3a0.super_AssertData.m_failed = true;
  local_3a0.super_AssertData.m_threw = false;
  local_3a0.super_AssertData.m_threw_as = false;
  local_3a0.super_AssertData.m_exception_type = "";
  local_3a0.super_AssertData.m_exception_string = "";
  uVar6 = local_180;
  do {
    while( true ) {
      uVar5 = uVar6;
      uVar8 = (ulong)(((uint)uVar5 & 0xf) << 4);
      uVar9 = *(ulong *)((long)local_2f8 + uVar8);
      uVar6 = local_180;
      if (uVar9 != uVar5 + 1) break;
      LOCK();
      bVar3 = uVar5 == local_180;
      if (bVar3) {
        local_180 = uVar9;
        uVar6 = uVar5;
      }
      UNLOCK();
      if (bVar3) {
        local_320.lhs = (unsigned_long)*(uint *)((long)auStack_300 + uVar8);
        *(ulong *)((long)local_2f8 + uVar8) = uVar5 + 0x10;
        uVar6 = 0x100000000;
        goto LAB_0013c9e9;
      }
    }
  } while (uVar5 + 1 <= uVar9);
  uVar6 = 0;
LAB_0013c9e9:
  local_320.lhs = local_320.lhs | uVar6;
  local_320.m_at = DT_REQUIRE;
  doctest::detail::Expression_lhs<const_std::optional<int>_>::operator==<std::nullopt_t,_nullptr>
            (&local_3c0,(Expression_lhs<const_std::optional<int>_> *)&local_320,
             (nullopt_t *)&std::nullopt);
  doctest::String::operator=(&local_3a0.super_AssertData.m_decomp,&local_3c0.m_decomp);
  local_3a0.super_AssertData._40_2_ =
       CONCAT11(local_3a0.super_AssertData.m_threw,local_3c0.m_passed) ^ 1;
  uVar10 = extraout_XMM0_Da_03;
  uVar11 = extraout_XMM0_Db_03;
  if ((local_3c0.m_decomp.field_0.buf[0x17] < '\0') &&
     (local_3c0.m_decomp.field_0.data.ptr != (char *)0x0)) {
    operator_delete__(local_3c0.m_decomp.field_0.data.ptr);
    uVar10 = extraout_XMM0_Da_04;
    uVar11 = extraout_XMM0_Db_04;
  }
  dVar2 = doctest::detail::ResultBuilder::log(&local_3a0,(double)CONCAT44(uVar11,uVar10));
  if (extraout_AL_01 != '\0') {
    pcVar1 = (code *)swi(3);
    (*pcVar1)(SUB84(dVar2,0));
    return;
  }
  if ((local_3a0.super_AssertData.m_failed == true) &&
     (bVar3 = doctest::detail::checkIfShouldThrow(local_3a0.super_AssertData.m_at), bVar3)) {
    doctest::detail::throwException();
  }
  if ((local_3a0.super_AssertData.m_decomp.field_0.buf[0x17] < '\0') &&
     ((void *)CONCAT71(local_3a0.super_AssertData.m_decomp.field_0._1_7_,
                       local_3a0.super_AssertData.m_decomp.field_0.buf[0]) != (void *)0x0)) {
    operator_delete__((void *)CONCAT71(local_3a0.super_AssertData.m_decomp.field_0._1_7_,
                                       local_3a0.super_AssertData.m_decomp.field_0.buf[0]));
  }
  if ((local_3a0.super_AssertData.m_exception.field_0.buf[0x17] < '\0') &&
     ((void *)CONCAT71(local_3a0.super_AssertData.m_exception.field_0._1_7_,
                       local_3a0.super_AssertData.m_exception.field_0.buf[0]) != (void *)0x0)) {
    operator_delete__((void *)CONCAT71(local_3a0.super_AssertData.m_exception.field_0._1_7_,
                                       local_3a0.super_AssertData.m_exception.field_0.buf[0]));
  }
  if (local_308 == 0) {
    uVar6 = 0;
  }
  else {
    uVar9 = 0;
    do {
      local_3a0.super_AssertData.m_exception.field_0.buf[0] = '\0';
      local_3a0.super_AssertData.m_exception.field_0.buf[0x17] = '\x17';
      local_3a0.super_AssertData.m_decomp.field_0.buf[0] = '\0';
      local_3a0.super_AssertData.m_decomp.field_0.buf[0x17] = '\x17';
      local_3a0.super_AssertData.m_test_case = *(TestCaseData **)(doctest::detail::g_cs + 0x20);
      local_3a0.super_AssertData.m_at = DT_REQUIRE;
      local_3a0.super_AssertData.m_file =
           "/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_queue.cpp"
      ;
      local_3a0.super_AssertData.m_line = 0x18c;
      local_3a0.super_AssertData.m_expr = "mpmc.try_enqueue(data[i]) == true";
      local_3a0.super_AssertData.m_failed = true;
      local_3a0.super_AssertData.m_threw = false;
      local_3a0.super_AssertData.m_threw_as = false;
      local_3a0.super_AssertData.m_exception_type = "";
      local_3a0.super_AssertData.m_exception_string = "";
      uVar6 = local_200;
      do {
        while( true ) {
          uVar8 = uVar6;
          uVar7 = (ulong)(((uint)uVar8 & 0xf) << 4);
          uVar5 = *(ulong *)((long)local_2f8 + uVar7);
          uVar6 = local_200;
          if (uVar5 != uVar8) break;
          LOCK();
          bVar3 = uVar8 == local_200;
          if (bVar3) {
            local_200 = uVar8 + 1;
            uVar6 = uVar8;
          }
          UNLOCK();
          if (bVar3) {
            *(undefined4 *)((long)auStack_300 + uVar7) = local_310[uVar9];
            *(ulong *)((long)local_2f8 + uVar7) = uVar8 + 1;
            goto LAB_0013cb9b;
          }
        }
      } while (uVar8 <= uVar5);
LAB_0013cb9b:
      local_320.lhs = (ulong)(uVar5 == uVar8) | 0xc00000000;
      local_3c1 = true;
      doctest::detail::Expression_lhs<bool_const>::operator==
                (&local_3c0,(Expression_lhs<bool_const> *)&local_320,&local_3c1);
      doctest::String::operator=(&local_3a0.super_AssertData.m_decomp,&local_3c0.m_decomp);
      local_3a0.super_AssertData._40_2_ =
           CONCAT11(local_3a0.super_AssertData.m_threw,local_3c0.m_passed) ^ 1;
      uVar10 = extraout_XMM0_Da_05;
      uVar11 = extraout_XMM0_Db_05;
      if ((local_3c0.m_decomp.field_0.buf[0x17] < '\0') &&
         (local_3c0.m_decomp.field_0.data.ptr != (char *)0x0)) {
        operator_delete__(local_3c0.m_decomp.field_0.data.ptr);
        uVar10 = extraout_XMM0_Da_06;
        uVar11 = extraout_XMM0_Db_06;
      }
      dVar2 = doctest::detail::ResultBuilder::log(&local_3a0,(double)CONCAT44(uVar11,uVar10));
      if (extraout_AL_02 != '\0') {
        pcVar1 = (code *)swi(3);
        (*pcVar1)(SUB84(dVar2,0));
        return;
      }
      if ((local_3a0.super_AssertData.m_failed == true) &&
         (bVar3 = doctest::detail::checkIfShouldThrow(local_3a0.super_AssertData.m_at), bVar3)) {
        doctest::detail::throwException();
      }
      if ((local_3a0.super_AssertData.m_decomp.field_0.buf[0x17] < '\0') &&
         ((void *)CONCAT71(local_3a0.super_AssertData.m_decomp.field_0._1_7_,
                           local_3a0.super_AssertData.m_decomp.field_0.buf[0]) != (void *)0x0)) {
        operator_delete__((void *)CONCAT71(local_3a0.super_AssertData.m_decomp.field_0._1_7_,
                                           local_3a0.super_AssertData.m_decomp.field_0.buf[0]));
      }
      if ((local_3a0.super_AssertData.m_exception.field_0.buf[0x17] < '\0') &&
         ((void *)CONCAT71(local_3a0.super_AssertData.m_exception.field_0._1_7_,
                           local_3a0.super_AssertData.m_exception.field_0.buf[0]) != (void *)0x0)) {
        operator_delete__((void *)CONCAT71(local_3a0.super_AssertData.m_exception.field_0._1_7_,
                                           local_3a0.super_AssertData.m_exception.field_0.buf[0]));
      }
      uVar9 = uVar9 + 1;
      uVar6 = local_308;
    } while (uVar9 < local_308);
  }
  local_3a0.super_AssertData.m_exception.field_0.buf[0] = '\0';
  local_3a0.super_AssertData.m_exception.field_0.buf[0x17] = '\x17';
  local_3a0.super_AssertData.m_decomp.field_0.buf[0] = '\0';
  local_3a0.super_AssertData.m_decomp.field_0.buf[0x17] = '\x17';
  local_3a0.super_AssertData.m_test_case = *(TestCaseData **)(doctest::detail::g_cs + 0x20);
  local_3a0.super_AssertData.m_at = DT_REQUIRE;
  local_3a0.super_AssertData.m_file =
       "/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_queue.cpp"
  ;
  local_3a0.super_AssertData.m_line = 399;
  local_3a0.super_AssertData.m_expr = "mpmc.try_enqueue(data[N]) == false";
  local_3a0.super_AssertData.m_failed = true;
  local_3a0.super_AssertData.m_threw = false;
  local_3a0.super_AssertData.m_threw_as = false;
  local_3a0.super_AssertData.m_exception_type = "";
  local_3a0.super_AssertData.m_exception_string = "";
  uVar9 = local_200;
  do {
    while( true ) {
      uVar8 = uVar9;
      uVar7 = (ulong)(((uint)uVar8 & 0xf) << 4);
      uVar5 = *(ulong *)((long)local_2f8 + uVar7);
      uVar9 = local_200;
      if (uVar5 != uVar8) break;
      LOCK();
      bVar3 = uVar8 == local_200;
      if (bVar3) {
        local_200 = uVar8 + 1;
        uVar9 = uVar8;
      }
      UNLOCK();
      if (bVar3) {
        *(undefined4 *)((long)auStack_300 + uVar7) = local_310[uVar6];
        *(ulong *)((long)local_2f8 + uVar7) = uVar8 + 1;
        goto LAB_0013cd77;
      }
    }
  } while (uVar8 <= uVar5);
LAB_0013cd77:
  local_320.lhs = (ulong)(uVar5 == uVar8) | 0xc00000000;
  local_3c1 = false;
  doctest::detail::Expression_lhs<bool_const>::operator==
            (&local_3c0,(Expression_lhs<bool_const> *)&local_320,&local_3c1);
  doctest::String::operator=(&local_3a0.super_AssertData.m_decomp,&local_3c0.m_decomp);
  local_3a0.super_AssertData._40_2_ =
       CONCAT11(local_3a0.super_AssertData.m_threw,local_3c0.m_passed) ^ 1;
  uVar10 = extraout_XMM0_Da_07;
  uVar11 = extraout_XMM0_Db_07;
  if ((local_3c0.m_decomp.field_0.buf[0x17] < '\0') &&
     (local_3c0.m_decomp.field_0.data.ptr != (char *)0x0)) {
    operator_delete__(local_3c0.m_decomp.field_0.data.ptr);
    uVar10 = extraout_XMM0_Da_08;
    uVar11 = extraout_XMM0_Db_08;
  }
  dVar2 = doctest::detail::ResultBuilder::log(&local_3a0,(double)CONCAT44(uVar11,uVar10));
  if (extraout_AL_03 != '\0') {
    pcVar1 = (code *)swi(3);
    (*pcVar1)(SUB84(dVar2,0));
    return;
  }
  if ((local_3a0.super_AssertData.m_failed == true) &&
     (bVar3 = doctest::detail::checkIfShouldThrow(local_3a0.super_AssertData.m_at), bVar3)) {
    doctest::detail::throwException();
  }
  if ((local_3a0.super_AssertData.m_decomp.field_0.buf[0x17] < '\0') &&
     ((void *)CONCAT71(local_3a0.super_AssertData.m_decomp.field_0._1_7_,
                       local_3a0.super_AssertData.m_decomp.field_0.buf[0]) != (void *)0x0)) {
    operator_delete__((void *)CONCAT71(local_3a0.super_AssertData.m_decomp.field_0._1_7_,
                                       local_3a0.super_AssertData.m_decomp.field_0.buf[0]));
  }
  if ((local_3a0.super_AssertData.m_exception.field_0.buf[0x17] < '\0') &&
     ((void *)CONCAT71(local_3a0.super_AssertData.m_exception.field_0._1_7_,
                       local_3a0.super_AssertData.m_exception.field_0.buf[0]) != (void *)0x0)) {
    operator_delete__((void *)CONCAT71(local_3a0.super_AssertData.m_exception.field_0._1_7_,
                                       local_3a0.super_AssertData.m_exception.field_0.buf[0]));
  }
  local_3a0.super_AssertData.m_exception.field_0.buf[0] = '\0';
  local_3a0.super_AssertData.m_exception.field_0.buf[0x17] = '\x17';
  local_3a0.super_AssertData.m_decomp.field_0.buf[0] = '\0';
  local_3a0.super_AssertData.m_decomp.field_0.buf[0x17] = '\x17';
  local_3a0.super_AssertData.m_test_case = *(TestCaseData **)(doctest::detail::g_cs + 0x20);
  local_3a0.super_AssertData.m_at = DT_REQUIRE;
  local_3a0.super_AssertData.m_file =
       "/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_queue.cpp"
  ;
  local_3a0.super_AssertData.m_line = 400;
  local_3a0.super_AssertData.m_expr = "mpmc.empty() == false";
  local_3a0.super_AssertData.m_failed = true;
  local_3a0.super_AssertData.m_threw = false;
  local_3a0.super_AssertData.m_threw_as = false;
  local_3a0.super_AssertData.m_exception_type = "";
  local_3a0.super_AssertData.m_exception_string = "";
  local_320.lhs = (ulong)(local_200 <= local_180) | 0xc00000000;
  local_3c1 = false;
  doctest::detail::Expression_lhs<bool_const>::operator==
            (&local_3c0,(Expression_lhs<bool_const> *)&local_320,&local_3c1);
  doctest::String::operator=(&local_3a0.super_AssertData.m_decomp,&local_3c0.m_decomp);
  local_3a0.super_AssertData._40_2_ =
       CONCAT11(local_3a0.super_AssertData.m_threw,local_3c0.m_passed) ^ 1;
  uVar10 = extraout_XMM0_Da_09;
  uVar11 = extraout_XMM0_Db_09;
  if ((local_3c0.m_decomp.field_0.buf[0x17] < '\0') &&
     (local_3c0.m_decomp.field_0.data.ptr != (char *)0x0)) {
    operator_delete__(local_3c0.m_decomp.field_0.data.ptr);
    uVar10 = extraout_XMM0_Da_10;
    uVar11 = extraout_XMM0_Db_10;
  }
  dVar2 = doctest::detail::ResultBuilder::log(&local_3a0,(double)CONCAT44(uVar11,uVar10));
  if (extraout_AL_04 != '\0') {
    pcVar1 = (code *)swi(3);
    (*pcVar1)(SUB84(dVar2,0));
    return;
  }
  if ((local_3a0.super_AssertData.m_failed == true) &&
     (bVar3 = doctest::detail::checkIfShouldThrow(local_3a0.super_AssertData.m_at), bVar3)) {
    doctest::detail::throwException();
  }
  if ((local_3a0.super_AssertData.m_decomp.field_0.buf[0x17] < '\0') &&
     ((void *)CONCAT71(local_3a0.super_AssertData.m_decomp.field_0._1_7_,
                       local_3a0.super_AssertData.m_decomp.field_0.buf[0]) != (void *)0x0)) {
    operator_delete__((void *)CONCAT71(local_3a0.super_AssertData.m_decomp.field_0._1_7_,
                                       local_3a0.super_AssertData.m_decomp.field_0.buf[0]));
  }
  if ((local_3a0.super_AssertData.m_exception.field_0.buf[0x17] < '\0') &&
     ((void *)CONCAT71(local_3a0.super_AssertData.m_exception.field_0._1_7_,
                       local_3a0.super_AssertData.m_exception.field_0.buf[0]) != (void *)0x0)) {
    operator_delete__((void *)CONCAT71(local_3a0.super_AssertData.m_exception.field_0._1_7_,
                                       local_3a0.super_AssertData.m_exception.field_0.buf[0]));
  }
  if (local_308 != 0) {
    uVar6 = 0;
    do {
      local_3a0.super_AssertData.m_exception.field_0.buf[0] = '\0';
      local_3a0.super_AssertData.m_exception.field_0.buf[0x17] = '\x17';
      local_3a0.super_AssertData.m_decomp.field_0.buf[0] = '\0';
      local_3a0.super_AssertData.m_decomp.field_0.buf[0x17] = '\x17';
      local_3a0.super_AssertData.m_test_case = *(TestCaseData **)(doctest::detail::g_cs + 0x20);
      local_3a0.super_AssertData.m_at = DT_REQUIRE;
      local_3a0.super_AssertData.m_file =
           "/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_queue.cpp"
      ;
      local_3a0.super_AssertData.m_line = 0x193;
      local_3a0.super_AssertData.m_expr = "mpmc.try_dequeue() == data[i]";
      local_3a0.super_AssertData.m_failed = true;
      local_3a0.super_AssertData.m_threw = false;
      local_3a0.super_AssertData.m_threw_as = false;
      local_3a0.super_AssertData.m_exception_type = "";
      local_3a0.super_AssertData.m_exception_string = "";
      uVar9 = local_180;
      do {
        while( true ) {
          uVar8 = uVar9;
          uVar7 = (ulong)(((uint)uVar8 & 0xf) << 4);
          uVar5 = *(ulong *)((long)local_2f8 + uVar7);
          uVar9 = local_180;
          if (uVar5 != uVar8 + 1) break;
          LOCK();
          bVar3 = uVar8 == local_180;
          if (bVar3) {
            local_180 = uVar5;
            uVar9 = uVar8;
          }
          UNLOCK();
          if (bVar3) {
            local_320.lhs = (unsigned_long)*(uint *)((long)auStack_300 + uVar7);
            *(ulong *)((long)local_2f8 + uVar7) = uVar8 + 0x10;
            uVar9 = 0x100000000;
            goto LAB_0013d092;
          }
        }
      } while (uVar8 + 1 <= uVar5);
      local_320.lhs = 0;
      uVar9 = 0;
LAB_0013d092:
      local_320.lhs = local_320.lhs | uVar9;
      local_320.m_at = DT_REQUIRE;
      doctest::detail::Expression_lhs<const_std::optional<int>_>::operator==<int,_nullptr>
                (&local_3c0,(Expression_lhs<const_std::optional<int>_> *)&local_320,
                 local_310 + uVar6);
      doctest::String::operator=(&local_3a0.super_AssertData.m_decomp,&local_3c0.m_decomp);
      local_3a0.super_AssertData._40_2_ =
           CONCAT11(local_3a0.super_AssertData.m_threw,local_3c0.m_passed) ^ 1;
      uVar10 = extraout_XMM0_Da_11;
      uVar11 = extraout_XMM0_Db_11;
      if ((local_3c0.m_decomp.field_0.buf[0x17] < '\0') &&
         (local_3c0.m_decomp.field_0.data.ptr != (char *)0x0)) {
        operator_delete__(local_3c0.m_decomp.field_0.data.ptr);
        uVar10 = extraout_XMM0_Da_12;
        uVar11 = extraout_XMM0_Db_12;
      }
      dVar2 = doctest::detail::ResultBuilder::log(&local_3a0,(double)CONCAT44(uVar11,uVar10));
      if (extraout_AL_05 != '\0') {
        pcVar1 = (code *)swi(3);
        (*pcVar1)(SUB84(dVar2,0));
        return;
      }
      if ((local_3a0.super_AssertData.m_failed == true) &&
         (bVar3 = doctest::detail::checkIfShouldThrow(local_3a0.super_AssertData.m_at), bVar3)) {
        doctest::detail::throwException();
      }
      if ((local_3a0.super_AssertData.m_decomp.field_0.buf[0x17] < '\0') &&
         ((void *)CONCAT71(local_3a0.super_AssertData.m_decomp.field_0._1_7_,
                           local_3a0.super_AssertData.m_decomp.field_0.buf[0]) != (void *)0x0)) {
        operator_delete__((void *)CONCAT71(local_3a0.super_AssertData.m_decomp.field_0._1_7_,
                                           local_3a0.super_AssertData.m_decomp.field_0.buf[0]));
      }
      if ((local_3a0.super_AssertData.m_exception.field_0.buf[0x17] < '\0') &&
         ((void *)CONCAT71(local_3a0.super_AssertData.m_exception.field_0._1_7_,
                           local_3a0.super_AssertData.m_exception.field_0.buf[0]) != (void *)0x0)) {
        operator_delete__((void *)CONCAT71(local_3a0.super_AssertData.m_exception.field_0._1_7_,
                                           local_3a0.super_AssertData.m_exception.field_0.buf[0]));
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 < local_308);
  }
  local_3a0.super_AssertData.m_exception.field_0.buf[0] = '\0';
  local_3a0.super_AssertData.m_exception.field_0.buf[0x17] = '\x17';
  local_3a0.super_AssertData.m_decomp.field_0.buf[0] = '\0';
  local_3a0.super_AssertData.m_decomp.field_0.buf[0x17] = '\x17';
  local_3a0.super_AssertData.m_test_case = *(TestCaseData **)(doctest::detail::g_cs + 0x20);
  local_3a0.super_AssertData.m_at = DT_REQUIRE;
  local_3a0.super_AssertData.m_file =
       "/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_queue.cpp"
  ;
  local_3a0.super_AssertData.m_line = 0x196;
  local_3a0.super_AssertData.m_expr = "mpmc.empty() == true";
  local_3a0.super_AssertData.m_failed = true;
  local_3a0.super_AssertData.m_threw = false;
  local_3a0.super_AssertData.m_threw_as = false;
  local_3a0.super_AssertData.m_exception_type = "";
  local_3a0.super_AssertData.m_exception_string = "";
  local_320.lhs = (ulong)(local_200 <= local_180) | 0xc00000000;
  local_3c1 = true;
  doctest::detail::Expression_lhs<bool_const>::operator==
            (&local_3c0,(Expression_lhs<bool_const> *)&local_320,&local_3c1);
  doctest::String::operator=(&local_3a0.super_AssertData.m_decomp,&local_3c0.m_decomp);
  local_3a0.super_AssertData._40_2_ =
       CONCAT11(local_3a0.super_AssertData.m_threw,local_3c0.m_passed) ^ 1;
  uVar10 = extraout_XMM0_Da_13;
  uVar11 = extraout_XMM0_Db_13;
  if ((local_3c0.m_decomp.field_0.buf[0x17] < '\0') &&
     (local_3c0.m_decomp.field_0.data.ptr != (char *)0x0)) {
    operator_delete__(local_3c0.m_decomp.field_0.data.ptr);
    uVar10 = extraout_XMM0_Da_14;
    uVar11 = extraout_XMM0_Db_14;
  }
  dVar2 = doctest::detail::ResultBuilder::log(&local_3a0,(double)CONCAT44(uVar11,uVar10));
  if (extraout_AL_06 != '\0') {
    pcVar1 = (code *)swi(3);
    (*pcVar1)(SUB84(dVar2,0));
    return;
  }
  if ((local_3a0.super_AssertData.m_failed == true) &&
     (bVar3 = doctest::detail::checkIfShouldThrow(local_3a0.super_AssertData.m_at), bVar3)) {
    doctest::detail::throwException();
  }
  if ((local_3a0.super_AssertData.m_decomp.field_0.buf[0x17] < '\0') &&
     ((void *)CONCAT71(local_3a0.super_AssertData.m_decomp.field_0._1_7_,
                       local_3a0.super_AssertData.m_decomp.field_0.buf[0]) != (void *)0x0)) {
    operator_delete__((void *)CONCAT71(local_3a0.super_AssertData.m_decomp.field_0._1_7_,
                                       local_3a0.super_AssertData.m_decomp.field_0.buf[0]));
  }
  if ((local_3a0.super_AssertData.m_exception.field_0.buf[0x17] < '\0') &&
     ((void *)CONCAT71(local_3a0.super_AssertData.m_exception.field_0._1_7_,
                       local_3a0.super_AssertData.m_exception.field_0.buf[0]) != (void *)0x0)) {
    operator_delete__((void *)CONCAT71(local_3a0.super_AssertData.m_exception.field_0._1_7_,
                                       local_3a0.super_AssertData.m_exception.field_0.buf[0]));
  }
  local_320.lhs = 0;
  local_3a0.super_AssertData.m_exception.field_0.buf[0] = '\0';
  local_3a0.super_AssertData.m_exception.field_0.buf[0x17] = '\x17';
  local_3a0.super_AssertData.m_decomp.field_0.buf[0] = '\0';
  local_3a0.super_AssertData.m_decomp.field_0.buf[0x17] = '\x17';
  local_3a0.super_AssertData.m_test_case = *(TestCaseData **)(doctest::detail::g_cs + 0x20);
  local_3a0.super_AssertData.m_at = DT_REQUIRE;
  local_3a0.super_AssertData.m_file =
       "/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_queue.cpp"
  ;
  local_3a0.super_AssertData.m_line = 0x197;
  local_3a0.super_AssertData.m_expr = "mpmc.try_dequeue() == std::nullopt";
  local_3a0.super_AssertData.m_failed = true;
  local_3a0.super_AssertData.m_threw = false;
  local_3a0.super_AssertData.m_threw_as = false;
  local_3a0.super_AssertData.m_exception_type = "";
  local_3a0.super_AssertData.m_exception_string = "";
  uVar6 = local_180;
  do {
    while( true ) {
      uVar5 = uVar6;
      uVar8 = (ulong)(((uint)uVar5 & 0xf) << 4);
      uVar9 = *(ulong *)((long)local_2f8 + uVar8);
      uVar6 = local_180;
      if (uVar9 != uVar5 + 1) break;
      LOCK();
      bVar3 = uVar5 == local_180;
      if (bVar3) {
        local_180 = uVar9;
        uVar6 = uVar5;
      }
      UNLOCK();
      if (bVar3) {
        local_320.lhs = (unsigned_long)*(uint *)((long)auStack_300 + uVar8);
        *(ulong *)((long)local_2f8 + uVar8) = uVar5 + 0x10;
        uVar6 = 0x100000000;
        goto LAB_0013d3c0;
      }
    }
  } while (uVar5 + 1 <= uVar9);
  uVar6 = 0;
LAB_0013d3c0:
  local_320.lhs = local_320.lhs | uVar6;
  local_320.m_at = DT_REQUIRE;
  doctest::detail::Expression_lhs<const_std::optional<int>_>::operator==<std::nullopt_t,_nullptr>
            (&local_3c0,(Expression_lhs<const_std::optional<int>_> *)&local_320,
             (nullopt_t *)&std::nullopt);
  doctest::String::operator=(&local_3a0.super_AssertData.m_decomp,&local_3c0.m_decomp);
  local_3a0.super_AssertData._40_2_ =
       CONCAT11(local_3a0.super_AssertData.m_threw,local_3c0.m_passed) ^ 1;
  uVar10 = extraout_XMM0_Da_15;
  uVar11 = extraout_XMM0_Db_15;
  if ((local_3c0.m_decomp.field_0.buf[0x17] < '\0') &&
     (local_3c0.m_decomp.field_0.data.ptr != (char *)0x0)) {
    operator_delete__(local_3c0.m_decomp.field_0.data.ptr);
    uVar10 = extraout_XMM0_Da_16;
    uVar11 = extraout_XMM0_Db_16;
  }
  dVar2 = doctest::detail::ResultBuilder::log(&local_3a0,(double)CONCAT44(uVar11,uVar10));
  if (extraout_AL_07 != '\0') {
    pcVar1 = (code *)swi(3);
    (*pcVar1)(SUB84(dVar2,0));
    return;
  }
  if ((local_3a0.super_AssertData.m_failed == true) &&
     (bVar3 = doctest::detail::checkIfShouldThrow(local_3a0.super_AssertData.m_at), bVar3)) {
    doctest::detail::throwException();
  }
  if ((local_3a0.super_AssertData.m_decomp.field_0.buf[0x17] < '\0') &&
     ((void *)CONCAT71(local_3a0.super_AssertData.m_decomp.field_0._1_7_,
                       local_3a0.super_AssertData.m_decomp.field_0.buf[0]) != (void *)0x0)) {
    operator_delete__((void *)CONCAT71(local_3a0.super_AssertData.m_decomp.field_0._1_7_,
                                       local_3a0.super_AssertData.m_decomp.field_0.buf[0]));
  }
  if ((local_3a0.super_AssertData.m_exception.field_0.buf[0x17] < '\0') &&
     ((void *)CONCAT71(local_3a0.super_AssertData.m_exception.field_0._1_7_,
                       local_3a0.super_AssertData.m_exception.field_0.buf[0]) != (void *)0x0)) {
    operator_delete__((void *)CONCAT71(local_3a0.super_AssertData.m_exception.field_0._1_7_,
                                       local_3a0.super_AssertData.m_exception.field_0.buf[0]));
  }
  if (local_308 == 0) {
    uVar9 = 0;
  }
  else {
    uVar6 = 0;
    do {
      uVar9 = local_200;
      do {
        do {
          uVar5 = uVar9;
          uVar8 = (ulong)(((uint)uVar5 & 0xf) << 4);
          uVar9 = local_200;
        } while (*(ulong *)((long)local_2f8 + uVar8) != uVar5);
        LOCK();
        bVar3 = uVar5 == local_200;
        if (bVar3) {
          local_200 = uVar5 + 1;
          uVar9 = uVar5;
        }
        UNLOCK();
      } while (!bVar3);
      *(undefined4 *)((long)auStack_300 + uVar8) = local_310[uVar6];
      *(ulong *)((long)local_2f8 + uVar8) = uVar5 + 1;
      uVar6 = uVar6 + 1;
      uVar9 = local_308;
    } while (uVar6 < local_308);
  }
  local_3a0.super_AssertData.m_exception.field_0.buf[0] = '\0';
  local_3a0.super_AssertData.m_exception.field_0.buf[0x17] = '\x17';
  local_3a0.super_AssertData.m_decomp.field_0.buf[0] = '\0';
  local_3a0.super_AssertData.m_decomp.field_0.buf[0x17] = '\x17';
  local_3a0.super_AssertData.m_test_case = *(TestCaseData **)(doctest::detail::g_cs + 0x20);
  local_3a0.super_AssertData.m_at = DT_REQUIRE;
  local_3a0.super_AssertData.m_file =
       "/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_queue.cpp"
  ;
  local_3a0.super_AssertData.m_line = 0x19c;
  local_3a0.super_AssertData.m_expr = "mpmc.try_enqueue(data[N]) == false";
  local_3a0.super_AssertData.m_failed = true;
  local_3a0.super_AssertData.m_threw = false;
  local_3a0.super_AssertData.m_threw_as = false;
  local_3a0.super_AssertData.m_exception_type = "";
  local_3a0.super_AssertData.m_exception_string = "";
  uVar6 = local_200;
  do {
    while( true ) {
      uVar8 = uVar6;
      uVar7 = (ulong)(((uint)uVar8 & 0xf) << 4);
      uVar5 = *(ulong *)((long)local_2f8 + uVar7);
      uVar6 = local_200;
      if (uVar5 != uVar8) break;
      LOCK();
      bVar3 = uVar8 == local_200;
      if (bVar3) {
        local_200 = uVar8 + 1;
        uVar6 = uVar8;
      }
      UNLOCK();
      if (bVar3) {
        *(undefined4 *)((long)auStack_300 + uVar7) = local_310[uVar9];
        *(ulong *)((long)local_2f8 + uVar7) = uVar8 + 1;
        goto LAB_0013d597;
      }
    }
  } while (uVar8 <= uVar5);
LAB_0013d597:
  local_320.lhs = (ulong)(uVar5 == uVar8) | 0xc00000000;
  local_3c1 = false;
  doctest::detail::Expression_lhs<bool_const>::operator==
            (&local_3c0,(Expression_lhs<bool_const> *)&local_320,&local_3c1);
  doctest::String::operator=(&local_3a0.super_AssertData.m_decomp,&local_3c0.m_decomp);
  local_3a0.super_AssertData._40_2_ =
       CONCAT11(local_3a0.super_AssertData.m_threw,local_3c0.m_passed) ^ 1;
  uVar10 = extraout_XMM0_Da_17;
  uVar11 = extraout_XMM0_Db_17;
  if ((local_3c0.m_decomp.field_0.buf[0x17] < '\0') &&
     (local_3c0.m_decomp.field_0.data.ptr != (char *)0x0)) {
    operator_delete__(local_3c0.m_decomp.field_0.data.ptr);
    uVar10 = extraout_XMM0_Da_18;
    uVar11 = extraout_XMM0_Db_18;
  }
  dVar2 = doctest::detail::ResultBuilder::log(&local_3a0,(double)CONCAT44(uVar11,uVar10));
  if (extraout_AL_08 != '\0') {
    pcVar1 = (code *)swi(3);
    (*pcVar1)(SUB84(dVar2,0));
    return;
  }
  if ((local_3a0.super_AssertData.m_failed == true) &&
     (bVar3 = doctest::detail::checkIfShouldThrow(local_3a0.super_AssertData.m_at), bVar3)) {
    doctest::detail::throwException();
  }
  if ((local_3a0.super_AssertData.m_decomp.field_0.buf[0x17] < '\0') &&
     ((void *)CONCAT71(local_3a0.super_AssertData.m_decomp.field_0._1_7_,
                       local_3a0.super_AssertData.m_decomp.field_0.buf[0]) != (void *)0x0)) {
    operator_delete__((void *)CONCAT71(local_3a0.super_AssertData.m_decomp.field_0._1_7_,
                                       local_3a0.super_AssertData.m_decomp.field_0.buf[0]));
  }
  if ((local_3a0.super_AssertData.m_exception.field_0.buf[0x17] < '\0') &&
     ((void *)CONCAT71(local_3a0.super_AssertData.m_exception.field_0._1_7_,
                       local_3a0.super_AssertData.m_exception.field_0.buf[0]) != (void *)0x0)) {
    operator_delete__((void *)CONCAT71(local_3a0.super_AssertData.m_exception.field_0._1_7_,
                                       local_3a0.super_AssertData.m_exception.field_0.buf[0]));
  }
  if (local_308 != 0) {
    uVar6 = 0;
    do {
      local_3a0.super_AssertData.m_exception.field_0.buf[0] = '\0';
      local_3a0.super_AssertData.m_exception.field_0.buf[0x17] = '\x17';
      local_3a0.super_AssertData.m_decomp.field_0.buf[0] = '\0';
      local_3a0.super_AssertData.m_decomp.field_0.buf[0x17] = '\x17';
      local_3a0.super_AssertData.m_test_case = *(TestCaseData **)(doctest::detail::g_cs + 0x20);
      local_3a0.super_AssertData.m_at = DT_REQUIRE;
      local_3a0.super_AssertData.m_file =
           "/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_queue.cpp"
      ;
      local_3a0.super_AssertData.m_line = 0x19f;
      local_3a0.super_AssertData.m_expr = "mpmc.empty() == false";
      local_3a0.super_AssertData.m_failed = true;
      local_3a0.super_AssertData.m_threw = false;
      local_3a0.super_AssertData.m_threw_as = false;
      local_3a0.super_AssertData.m_exception_type = "";
      local_3a0.super_AssertData.m_exception_string = "";
      local_320.lhs = (ulong)(local_200 <= local_180) | 0xc00000000;
      local_3c1 = false;
      doctest::detail::Expression_lhs<bool_const>::operator==
                (&local_3c0,(Expression_lhs<bool_const> *)&local_320,&local_3c1);
      doctest::String::operator=(&local_3a0.super_AssertData.m_decomp,&local_3c0.m_decomp);
      local_3a0.super_AssertData._40_2_ =
           CONCAT11(local_3a0.super_AssertData.m_threw,local_3c0.m_passed) ^ 1;
      uVar10 = extraout_XMM0_Da_19;
      uVar11 = extraout_XMM0_Db_19;
      if ((local_3c0.m_decomp.field_0.buf[0x17] < '\0') &&
         (local_3c0.m_decomp.field_0.data.ptr != (char *)0x0)) {
        operator_delete__(local_3c0.m_decomp.field_0.data.ptr);
        uVar10 = extraout_XMM0_Da_20;
        uVar11 = extraout_XMM0_Db_20;
      }
      dVar2 = doctest::detail::ResultBuilder::log(&local_3a0,(double)CONCAT44(uVar11,uVar10));
      if (extraout_AL_09 != '\0') {
        pcVar1 = (code *)swi(3);
        (*pcVar1)(SUB84(dVar2,0));
        return;
      }
      if ((local_3a0.super_AssertData.m_failed == true) &&
         (bVar3 = doctest::detail::checkIfShouldThrow(local_3a0.super_AssertData.m_at), bVar3)) {
        doctest::detail::throwException();
      }
      if ((local_3a0.super_AssertData.m_decomp.field_0.buf[0x17] < '\0') &&
         ((void *)CONCAT71(local_3a0.super_AssertData.m_decomp.field_0._1_7_,
                           local_3a0.super_AssertData.m_decomp.field_0.buf[0]) != (void *)0x0)) {
        operator_delete__((void *)CONCAT71(local_3a0.super_AssertData.m_decomp.field_0._1_7_,
                                           local_3a0.super_AssertData.m_decomp.field_0.buf[0]));
      }
      if ((local_3a0.super_AssertData.m_exception.field_0.buf[0x17] < '\0') &&
         ((void *)CONCAT71(local_3a0.super_AssertData.m_exception.field_0._1_7_,
                           local_3a0.super_AssertData.m_exception.field_0.buf[0]) != (void *)0x0)) {
        operator_delete__((void *)CONCAT71(local_3a0.super_AssertData.m_exception.field_0._1_7_,
                                           local_3a0.super_AssertData.m_exception.field_0.buf[0]));
      }
      local_3a0.super_AssertData.m_exception.field_0.buf[0] = '\0';
      local_3a0.super_AssertData.m_exception.field_0.buf[0x17] = '\x17';
      local_3a0.super_AssertData.m_decomp.field_0.buf[0] = '\0';
      local_3a0.super_AssertData.m_decomp.field_0.buf[0x17] = '\x17';
      local_3a0.super_AssertData.m_test_case = *(TestCaseData **)(doctest::detail::g_cs + 0x20);
      local_3a0.super_AssertData.m_at = DT_REQUIRE;
      local_3a0.super_AssertData.m_file =
           "/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_queue.cpp"
      ;
      local_3a0.super_AssertData.m_line = 0x1a0;
      local_3a0.super_AssertData.m_expr = "mpmc.try_dequeue() == data[i]";
      local_3a0.super_AssertData.m_failed = true;
      local_3a0.super_AssertData.m_threw = false;
      local_3a0.super_AssertData.m_threw_as = false;
      local_3a0.super_AssertData.m_exception_type = "";
      local_3a0.super_AssertData.m_exception_string = "";
      uVar9 = local_180;
      do {
        while( true ) {
          uVar8 = uVar9;
          uVar7 = (ulong)(((uint)uVar8 & 0xf) << 4);
          uVar5 = *(ulong *)((long)local_2f8 + uVar7);
          uVar9 = local_180;
          if (uVar5 != uVar8 + 1) break;
          LOCK();
          bVar3 = uVar8 == local_180;
          if (bVar3) {
            local_180 = uVar5;
            uVar9 = uVar8;
          }
          UNLOCK();
          if (bVar3) {
            local_320.lhs = (unsigned_long)*(uint *)((long)auStack_300 + uVar7);
            *(ulong *)((long)local_2f8 + uVar7) = uVar8 + 0x10;
            uVar9 = 0x100000000;
            goto LAB_0013d8aa;
          }
        }
      } while (uVar8 + 1 <= uVar5);
      local_320.lhs = 0;
      uVar9 = 0;
LAB_0013d8aa:
      local_320.lhs = local_320.lhs | uVar9;
      local_320.m_at = DT_REQUIRE;
      doctest::detail::Expression_lhs<const_std::optional<int>_>::operator==<int,_nullptr>
                (&local_3c0,(Expression_lhs<const_std::optional<int>_> *)&local_320,
                 local_310 + uVar6);
      doctest::String::operator=(&local_3a0.super_AssertData.m_decomp,&local_3c0.m_decomp);
      local_3a0.super_AssertData._40_2_ =
           CONCAT11(local_3a0.super_AssertData.m_threw,local_3c0.m_passed) ^ 1;
      uVar10 = extraout_XMM0_Da_21;
      uVar11 = extraout_XMM0_Db_21;
      if ((local_3c0.m_decomp.field_0.buf[0x17] < '\0') &&
         (local_3c0.m_decomp.field_0.data.ptr != (char *)0x0)) {
        operator_delete__(local_3c0.m_decomp.field_0.data.ptr);
        uVar10 = extraout_XMM0_Da_22;
        uVar11 = extraout_XMM0_Db_22;
      }
      dVar2 = doctest::detail::ResultBuilder::log(&local_3a0,(double)CONCAT44(uVar11,uVar10));
      if (extraout_AL_10 != '\0') {
        pcVar1 = (code *)swi(3);
        (*pcVar1)(SUB84(dVar2,0));
        return;
      }
      if ((local_3a0.super_AssertData.m_failed == true) &&
         (bVar3 = doctest::detail::checkIfShouldThrow(local_3a0.super_AssertData.m_at), bVar3)) {
        doctest::detail::throwException();
      }
      if ((local_3a0.super_AssertData.m_decomp.field_0.buf[0x17] < '\0') &&
         ((void *)CONCAT71(local_3a0.super_AssertData.m_decomp.field_0._1_7_,
                           local_3a0.super_AssertData.m_decomp.field_0.buf[0]) != (void *)0x0)) {
        operator_delete__((void *)CONCAT71(local_3a0.super_AssertData.m_decomp.field_0._1_7_,
                                           local_3a0.super_AssertData.m_decomp.field_0.buf[0]));
      }
      if ((local_3a0.super_AssertData.m_exception.field_0.buf[0x17] < '\0') &&
         ((void *)CONCAT71(local_3a0.super_AssertData.m_exception.field_0._1_7_,
                           local_3a0.super_AssertData.m_exception.field_0.buf[0]) != (void *)0x0)) {
        operator_delete__((void *)CONCAT71(local_3a0.super_AssertData.m_exception.field_0._1_7_,
                                           local_3a0.super_AssertData.m_exception.field_0.buf[0]));
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 < local_308);
  }
  local_3a0.super_AssertData.m_exception.field_0.buf[0] = '\0';
  local_3a0.super_AssertData.m_exception.field_0.buf[0x17] = '\x17';
  local_3a0.super_AssertData.m_decomp.field_0.buf[0] = '\0';
  local_3a0.super_AssertData.m_decomp.field_0.buf[0x17] = '\x17';
  local_3a0.super_AssertData.m_test_case = *(TestCaseData **)(doctest::detail::g_cs + 0x20);
  local_3a0.super_AssertData.m_at = DT_REQUIRE;
  local_3a0.super_AssertData.m_file =
       "/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_queue.cpp"
  ;
  local_3a0.super_AssertData.m_line = 0x1a3;
  local_3a0.super_AssertData.m_expr = "mpmc.empty() == true";
  local_3a0.super_AssertData.m_failed = true;
  local_3a0.super_AssertData.m_threw = false;
  local_3a0.super_AssertData.m_threw_as = false;
  local_3a0.super_AssertData.m_exception_type = "";
  local_3a0.super_AssertData.m_exception_string = "";
  local_320.lhs = (ulong)(local_200 <= local_180) | 0xc00000000;
  local_3c1 = true;
  doctest::detail::Expression_lhs<bool_const>::operator==
            (&local_3c0,(Expression_lhs<bool_const> *)&local_320,&local_3c1);
  doctest::String::operator=(&local_3a0.super_AssertData.m_decomp,&local_3c0.m_decomp);
  local_3a0.super_AssertData._40_2_ =
       CONCAT11(local_3a0.super_AssertData.m_threw,local_3c0.m_passed) ^ 1;
  uVar10 = extraout_XMM0_Da_23;
  uVar11 = extraout_XMM0_Db_23;
  if ((local_3c0.m_decomp.field_0.buf[0x17] < '\0') &&
     (local_3c0.m_decomp.field_0.data.ptr != (char *)0x0)) {
    operator_delete__(local_3c0.m_decomp.field_0.data.ptr);
    uVar10 = extraout_XMM0_Da_24;
    uVar11 = extraout_XMM0_Db_24;
  }
  dVar2 = doctest::detail::ResultBuilder::log(&local_3a0,(double)CONCAT44(uVar11,uVar10));
  if (extraout_AL_11 != '\0') {
    pcVar1 = (code *)swi(3);
    (*pcVar1)(SUB84(dVar2,0));
    return;
  }
  if ((local_3a0.super_AssertData.m_failed == true) &&
     (bVar3 = doctest::detail::checkIfShouldThrow(local_3a0.super_AssertData.m_at), bVar3)) {
    doctest::detail::throwException();
  }
  if ((local_3a0.super_AssertData.m_decomp.field_0.buf[0x17] < '\0') &&
     ((void *)CONCAT71(local_3a0.super_AssertData.m_decomp.field_0._1_7_,
                       local_3a0.super_AssertData.m_decomp.field_0.buf[0]) != (void *)0x0)) {
    operator_delete__((void *)CONCAT71(local_3a0.super_AssertData.m_decomp.field_0._1_7_,
                                       local_3a0.super_AssertData.m_decomp.field_0.buf[0]));
  }
  if ((local_3a0.super_AssertData.m_exception.field_0.buf[0x17] < '\0') &&
     ((void *)CONCAT71(local_3a0.super_AssertData.m_exception.field_0._1_7_,
                       local_3a0.super_AssertData.m_exception.field_0.buf[0]) != (void *)0x0)) {
    operator_delete__((void *)CONCAT71(local_3a0.super_AssertData.m_exception.field_0._1_7_,
                                       local_3a0.super_AssertData.m_exception.field_0.buf[0]));
  }
  local_320.lhs = 0;
  local_3a0.super_AssertData.m_exception.field_0.buf[0] = '\0';
  local_3a0.super_AssertData.m_exception.field_0.buf[0x17] = '\x17';
  local_3a0.super_AssertData.m_decomp.field_0.buf[0] = '\0';
  local_3a0.super_AssertData.m_decomp.field_0.buf[0x17] = '\x17';
  local_3a0.super_AssertData.m_test_case = *(TestCaseData **)(doctest::detail::g_cs + 0x20);
  local_3a0.super_AssertData.m_at = DT_REQUIRE;
  local_3a0.super_AssertData.m_file =
       "/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_queue.cpp"
  ;
  local_3a0.super_AssertData.m_line = 0x1a4;
  local_3a0.super_AssertData.m_expr = "mpmc.try_dequeue() == std::nullopt";
  local_3a0.super_AssertData.m_failed = true;
  local_3a0.super_AssertData.m_threw = false;
  local_3a0.super_AssertData.m_threw_as = false;
  local_3a0.super_AssertData.m_exception_type = "";
  local_3a0.super_AssertData.m_exception_string = "";
  uVar6 = local_180;
  do {
    while( true ) {
      uVar5 = uVar6;
      uVar8 = (ulong)(((uint)uVar5 & 0xf) << 4);
      uVar9 = *(ulong *)((long)local_2f8 + uVar8);
      uVar6 = local_180;
      if (uVar9 == uVar5 + 1) break;
      if (uVar9 < uVar5 + 1) {
        uVar6 = 0;
LAB_0013dc22:
        local_320.lhs = local_320.lhs | uVar6;
        local_320.m_at = DT_REQUIRE;
        doctest::detail::Expression_lhs<const_std::optional<int>_>::
        operator==<std::nullopt_t,_nullptr>
                  (&local_3c0,(Expression_lhs<const_std::optional<int>_> *)&local_320,
                   (nullopt_t *)&std::nullopt);
        doctest::String::operator=(&local_3a0.super_AssertData.m_decomp,&local_3c0.m_decomp);
        local_3a0.super_AssertData._40_2_ =
             CONCAT11(local_3a0.super_AssertData.m_threw,local_3c0.m_passed) ^ 1;
        uVar10 = extraout_XMM0_Da_25;
        uVar11 = extraout_XMM0_Db_25;
        if ((local_3c0.m_decomp.field_0.buf[0x17] < '\0') &&
           (local_3c0.m_decomp.field_0.data.ptr != (char *)0x0)) {
          operator_delete__(local_3c0.m_decomp.field_0.data.ptr);
          uVar10 = extraout_XMM0_Da_26;
          uVar11 = extraout_XMM0_Db_26;
        }
        dVar2 = doctest::detail::ResultBuilder::log(&local_3a0,(double)CONCAT44(uVar11,uVar10));
        if (extraout_AL_12 == '\0') {
          if ((local_3a0.super_AssertData.m_failed == true) &&
             (bVar3 = doctest::detail::checkIfShouldThrow(local_3a0.super_AssertData.m_at), bVar3))
          {
            doctest::detail::throwException();
          }
          if ((local_3a0.super_AssertData.m_decomp.field_0.buf[0x17] < '\0') &&
             ((void *)CONCAT71(local_3a0.super_AssertData.m_decomp.field_0._1_7_,
                               local_3a0.super_AssertData.m_decomp.field_0.buf[0]) != (void *)0x0))
          {
            operator_delete__((void *)CONCAT71(local_3a0.super_AssertData.m_decomp.field_0._1_7_,
                                               local_3a0.super_AssertData.m_decomp.field_0.buf[0]));
          }
          if ((local_3a0.super_AssertData.m_exception.field_0.buf[0x17] < '\0') &&
             ((void *)CONCAT71(local_3a0.super_AssertData.m_exception.field_0._1_7_,
                               local_3a0.super_AssertData.m_exception.field_0.buf[0]) != (void *)0x0
             )) {
            operator_delete__((void *)CONCAT71(local_3a0.super_AssertData.m_exception.field_0._1_7_,
                                               local_3a0.super_AssertData.m_exception.field_0.buf[0]
                                              ));
          }
          operator_delete(local_310,0x44);
          return;
        }
        pcVar1 = (code *)swi(3);
        (*pcVar1)(SUB84(dVar2,0));
        return;
      }
    }
    LOCK();
    bVar3 = uVar5 == local_180;
    if (bVar3) {
      local_180 = uVar9;
      uVar6 = uVar5;
    }
    UNLOCK();
  } while (!bVar3);
  local_320.lhs = (unsigned_long)*(uint *)((long)auStack_300 + uVar8);
  *(ulong *)((long)local_2f8 + uVar8) = uVar5 + 0x10;
  uVar6 = 0x100000000;
  goto LAB_0013dc22;
}

Assistant:

void mpmc_basics() {

  tf::MPMC<T, LogSize> mpmc;
  size_t N = (1<<LogSize);
  std::vector<T> data(N+1, -1);

  REQUIRE(mpmc.capacity() == N);

  REQUIRE(mpmc.empty() == true);
  REQUIRE(mpmc.try_dequeue() == std::nullopt);

  for(size_t i=0; i<N; i++) {
    REQUIRE(mpmc.try_enqueue(data[i]) == true);
  }

  REQUIRE(mpmc.try_enqueue(data[N]) == false);
  REQUIRE(mpmc.empty() == false);

  for(size_t i=0; i<N; i++) {
    REQUIRE(mpmc.try_dequeue() == data[i]);
  }

  REQUIRE(mpmc.empty() == true); 
  REQUIRE(mpmc.try_dequeue() == std::nullopt);

  for(size_t i=0; i<N; i++) {
    mpmc.enqueue(data[i]);
  }
  REQUIRE(mpmc.try_enqueue(data[N]) == false);
  
  for(size_t i=0; i<N; i++) {
    REQUIRE(mpmc.empty() == false);
    REQUIRE(mpmc.try_dequeue() == data[i]);
  }

  REQUIRE(mpmc.empty() == true); 
  REQUIRE(mpmc.try_dequeue() == std::nullopt);
}